

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffiblk(fitsfile *fptr,long nblock,int headdata,int *status)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  FITSfile *pFVar7;
  long lVar8;
  LONGLONG bytepos;
  char *buffer;
  char *pcVar9;
  bool bVar10;
  int typhdu;
  char card [81];
  char buff2 [2880];
  char buff1 [2880];
  
  iVar4 = *status;
  if (0 < nblock && iVar4 < 1) {
    pFVar7 = fptr->Fptr;
    if (headdata == 0) {
      bytepos = pFVar7->datastart;
      bVar6 = 0x20;
    }
    else {
      bVar6 = (pFVar7->hdutype == 1) << 5;
      if (headdata == -1) {
        builtin_strncpy(card + 0x20,"IMAGE extension",0x10);
        builtin_strncpy(card + 0x10,"   \'          / ",0x10);
        builtin_strncpy(card,"XTENSION= \'IMAGE",0x10);
        bytepos = 0;
      }
      else {
        lVar8 = pFVar7->heapstart + pFVar7->datastart + pFVar7->heapsize + 0xb3f;
        bytepos = lVar8 - lVar8 % 0xb40;
      }
    }
    memset(buff2,(uint)bVar6,0xb40);
    if (nblock == 1) {
      if (headdata == -1) {
        ffmrec(fptr,1,card,status);
      }
      ffmbyt(fptr,bytepos,0,status);
      ffgbyt(fptr,0xb40,buff1,status);
      pcVar2 = buff2;
      pcVar9 = buff1;
      while (buffer = pcVar2, *status < 1) {
        ffmbyt(fptr,bytepos,0,status);
        ffpbyt(fptr,0xb40,buffer,status);
        if (0 < *status) {
          return *status;
        }
        bytepos = bytepos + 0xb40;
        ffmbyt(fptr,bytepos,0,status);
        ffgbyt(fptr,0xb40,buffer,status);
        pcVar2 = pcVar9;
        pcVar9 = buffer;
      }
      *status = iVar4;
      ffmbyt(fptr,bytepos,1,status);
      ffpbyt(fptr,0xb40,buffer,status);
    }
    else {
      iVar1 = pFVar7->curhdu;
      iVar3 = iVar4;
      while (iVar3 < 1) {
        ffmrhd(fptr,1,&typhdu,status);
        iVar3 = *status;
      }
      if (iVar3 == 0x6b) {
        *status = iVar4;
      }
      ffmahd(fptr,iVar1 + 1,&typhdu,status);
      if (headdata == -1) {
        ffmrec(fptr,1,card,status);
      }
      lVar8 = fptr->Fptr->headstart[(long)fptr->Fptr->maxhdu + 1];
      lVar5 = (lVar8 - bytepos) / 0xb40;
      if (lVar5 < 1) {
        lVar5 = 0;
      }
      while( true ) {
        lVar8 = lVar8 + -0xb40;
        bVar10 = lVar5 == 0;
        lVar5 = lVar5 + -1;
        if (bVar10) break;
        iVar4 = ffmbyt(fptr,lVar8,0,status);
        if (0 < iVar4) goto LAB_0017c2b0;
        ffgbyt(fptr,0xb40,buff1,status);
        ffmbyt(fptr,nblock * 0xb40 + lVar8,1,status);
        ffpbyt(fptr,0xb40,buff1,status);
      }
      ffmbyt(fptr,bytepos,1,status);
      lVar8 = nblock;
      while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
        ffpbyt(fptr,0xb40,buff2,status);
      }
    }
    if (headdata == 0) {
      pFVar7 = fptr->Fptr;
      pFVar7->datastart = pFVar7->datastart + nblock * 0xb40;
    }
    else {
      pFVar7 = fptr->Fptr;
    }
    iVar4 = pFVar7->maxhdu;
    for (lVar8 = (long)pFVar7->curhdu; lVar8 <= iVar4; lVar8 = lVar8 + 1) {
      pFVar7->headstart[lVar8 + 1] = pFVar7->headstart[lVar8 + 1] + nblock * 0xb40;
    }
LAB_0017c2b0:
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffiblk(fitsfile *fptr,      /* I - FITS file pointer               */
           long nblock,         /* I - no. of blocks to insert         */ 
           int headdata,        /* I - insert where? 0=header, 1=data  */
                                /*     -1=beginning of file            */
           int *status)         /* IO - error status                   */
/*
   insert 2880-byte blocks at the end of the current header or data unit
*/
{
    int tstatus, savehdu, typhdu;
    LONGLONG insertpt, jpoint;
    long ii, nshift;
    char charfill;
    char buff1[2880], buff2[2880];
    char *inbuff, *outbuff, *tmpbuff;
    char card[FLEN_CARD];

    if (*status > 0 || nblock <= 0)
        return(*status);
        
    tstatus = *status;

    if (headdata == 0 || (fptr->Fptr)->hdutype == ASCII_TBL)
        charfill = 32;  /* headers and ASCII tables have space (32) fill */
    else
        charfill = 0;   /* images and binary tables have zero fill */

    if (headdata == 0)  
        insertpt = (fptr->Fptr)->datastart;  /* insert just before data, or */
    else if (headdata == -1)
    {
        insertpt = 0;
        strcpy(card, "XTENSION= 'IMAGE   '          / IMAGE extension");
    }
    else                                     /* at end of data, */
    {
        insertpt = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
        insertpt = ((insertpt + 2879) / 2880) * 2880; /* start of block */

       /* the following formula is wrong because the current data unit
          may have been extended without updating the headstart value
          of the following HDU.
       */
       /* insertpt = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1]; */
    }

    inbuff  = buff1;   /* set pointers to input and output buffers */
    outbuff = buff2;

    memset(outbuff, charfill, 2880); /* initialize buffer with fill */

    if (nblock == 1)  /* insert one block */
    {
      if (headdata == -1)
        ffmrec(fptr, 1, card, status);    /* change SIMPLE -> XTENSION */

      ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to 1st point */
      ffgbyt(fptr, 2880, inbuff, status);  /* read first block of bytes */

      while (*status <= 0)
      {
        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* insert point */
        ffpbyt(fptr, 2880, outbuff, status);  /* write the output buffer */

        if (*status > 0)
            return(*status);

        tmpbuff = inbuff;   /* swap input and output pointers */
        inbuff = outbuff;
        outbuff = tmpbuff;
        insertpt += 2880;  /* increment insert point by 1 block */

        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to next block */
        ffgbyt(fptr, 2880, inbuff, status);  /* read block of bytes */
      }

      *status = tstatus;  /* reset status value */
      ffmbyt(fptr, insertpt, IGNORE_EOF, status); /* move back to insert pt */
      ffpbyt(fptr, 2880, outbuff, status);  /* write the final block */
    }

    else   /*  inserting more than 1 block */

    {
        savehdu = (fptr->Fptr)->curhdu;  /* save the current HDU number */
        tstatus = *status;
        while(*status <= 0)  /* find the last HDU in file */
              ffmrhd(fptr, 1, &typhdu, status);

        if (*status == END_OF_FILE)
        {
            *status = tstatus;
        }

        ffmahd(fptr, savehdu + 1, &typhdu, status);  /* move back to CHDU */
        if (headdata == -1)
          ffmrec(fptr, 1, card, status); /* NOW change SIMPLE -> XTENSION */

        /* number of 2880-byte blocks that have to be shifted down */
        nshift = (long) (((fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - insertpt)
                 / 2880);
        /* position of last block in file to be shifted */
        jpoint =  (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - 2880;

        /* move all the blocks starting at end of file working backwards */
        for (ii = 0; ii < nshift; ii++)
        {
            /* move to the read start position */
            if (ffmbyt(fptr, jpoint, REPORT_EOF, status) > 0)
                return(*status);

            ffgbyt(fptr, 2880, inbuff,status);  /* read one record */

            /* move forward to the write postion */
            ffmbyt(fptr, jpoint + ((LONGLONG) nblock * 2880), IGNORE_EOF, status);

            ffpbyt(fptr, 2880, inbuff, status);  /* write the record */

            jpoint -= 2880;
        }

        /* move back to the write start postion (might be EOF) */
        ffmbyt(fptr, insertpt, IGNORE_EOF, status);

        for (ii = 0; ii < nblock; ii++)   /* insert correct fill value */
             ffpbyt(fptr, 2880, outbuff, status);
    }

    if (headdata == 0)         /* update data start address */
      (fptr->Fptr)->datastart += ((LONGLONG) nblock * 2880);

    /* update following HDU addresses */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] += ((LONGLONG) nblock * 2880);

    return(*status);
}